

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockSupport_c_successWithOutputParameterOfType_TestShell::createTest
          (TEST_MockSupport_c_successWithOutputParameterOfType_TestShell *this)

{
  Utest *this_00;
  TEST_MockSupport_c_successWithOutputParameterOfType_TestShell *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupport_cTest.cpp"
                                  ,0x2ec);
  TEST_MockSupport_c_successWithOutputParameterOfType_Test::
  TEST_MockSupport_c_successWithOutputParameterOfType_Test
            ((TEST_MockSupport_c_successWithOutputParameterOfType_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockSupport_c, successWithOutputParameterOfType)
{
    TestTestingFixture fixture;
    mock_c()->installCopier("intType", typeCopy);
    fixture.setTestFunction(callToMockCWithOutputParameterOfType_);
    fixture.runAllTests();
    LONGS_EQUAL(2, fixture.getCheckCount());
    LONGS_EQUAL(0, fixture.getFailureCount());
    mock_c()->removeAllComparatorsAndCopiers();
}